

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<asd::FrameData<short,_asd::container::vec>_> * __thiscall
pybind11::class_<asd::FrameData<short,asd::container::vec>>::
def_buffer<add_frame_data(pybind11::module_&)::__0>
          (class_<asd::FrameData<short,asd::container::vec>> *this,
          anon_class_1_0_00000001_for_func *func)

{
  _func_buffer_info_ptr_PyObject_ptr_void_ptr *get_buffer;
  type local_50;
  handle local_48;
  PyObject *local_40;
  handle local_38;
  object local_30;
  _lambda__object__void___1_ local_21;
  capture *local_20;
  capture *ptr;
  anon_class_1_0_00000001_for_func *func_local;
  class_<asd::FrameData<short,_asd::container::vec>_> *this_local;
  
  ptr = (capture *)func;
  func_local = (anon_class_1_0_00000001_for_func *)this;
  local_20 = (capture *)operator_new(1);
  get_buffer = class_::def_buffer(add_frame_data(pybind11::module_&)::$_0&&)::
               {lambda(_object*,void*)#1}::operator_cast_to_function_pointer(&local_21);
  detail::generic_type::install_buffer_funcs((generic_type *)this,get_buffer,local_20);
  pybind11::handle::handle<_object_*,_0>(&local_38,*(_object **)this);
  local_50.ptr = local_20;
  cpp_function::
  cpp_function<pybind11::class_<asd::FrameData<short,asd::container::vec>>::def_buffer<add_frame_data(pybind11::module_&)::__0>(add_frame_data(pybind11::module_&)::__0&&)::_lambda(pybind11::handle)_1_,,void>
            ((cpp_function *)&local_48,&local_50);
  local_40 = local_48.m_ptr;
  weakref::weakref((weakref *)&local_30,local_38,local_48);
  object::release(&local_30);
  weakref::~weakref((weakref *)&local_30);
  cpp_function::~cpp_function((cpp_function *)&local_48);
  return (class_<asd::FrameData<short,_asd::container::vec>_> *)this;
}

Assistant:

class_ &def_buffer(Func &&func) {
        struct capture {
            Func func;
        };
        auto *ptr = new capture{std::forward<Func>(func)};
        install_buffer_funcs(
            [](PyObject *obj, void *ptr) -> buffer_info * {
                detail::make_caster<type> caster;
                if (!caster.load(obj, false)) {
                    return nullptr;
                }
                return new buffer_info(((capture *) ptr)->func(std::move(caster)));
            },
            ptr);
        weakref(m_ptr, cpp_function([ptr](handle wr) {
                    delete ptr;
                    wr.dec_ref();
                }))
            .release();
        return *this;
    }